

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_Vec2Offset
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  undefined8 *puVar3;
  double *pdVar4;
  PClass *pPVar5;
  int iVar6;
  undefined8 uVar7;
  PClass *pPVar8;
  char *pcVar9;
  bool bVar10;
  DVector2 u;
  double local_48;
  double local_40;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar3 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar10 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar5 && bVar10) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar10 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar5) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004365b9;
        }
      }
      if (numparam == 1) {
        pcVar9 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar9 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              pVVar1 = param + 1;
              pVVar2 = param + 2;
              if (numparam == 3) {
                param = defaultparam->Array;
                if (param[3].field_0.field_3.Type == '\0') {
LAB_004364d8:
                  if (param[3].field_0.i == 0) {
                    P_GetOffsetPosition((double)puVar3[9],(double)puVar3[10],(pVVar1->field_0).f,
                                        (pVVar2->field_0).f);
                  }
                  else {
                    local_48 = (pVVar1->field_0).f + (double)puVar3[9];
                    local_40 = (pVVar2->field_0).f + (double)puVar3[10];
                  }
                  if (numret < 1) {
                    iVar6 = 0;
                  }
                  else {
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != nullptr",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                    ,0x1e75,
                                    "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    if (ret->RegType != '\t') {
                      __assert_fail("RegType == (REGT_FLOAT | REGT_MULTIREG2)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                    ,0x15d,"void VMReturn::SetVector2(const DVector2 &)");
                    }
                    pdVar4 = (double *)ret->Location;
                    *pdVar4 = local_48;
                    pdVar4[1] = local_40;
                    iVar6 = 1;
                  }
                  return iVar6;
                }
                pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
              }
              else {
                if (param[3].field_0.field_3.Type == '\0') goto LAB_004364d8;
                pcVar9 = "(param[paramnum]).Type == REGT_INT";
              }
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1e74,
                            "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar9 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar9,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1e73,
                        "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar9 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e72,
                    "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004365b9:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e71,
                "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec2Offset)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_VEC2(self->Vec2Offset(x, y, absolute));
}